

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImageLoader::load_mres_link(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  ulong read_len;
  uint uVar1;
  ulong read_len_00;
  bool bVar2;
  char buf_1 [1];
  ulong siz_local;
  CVmImageLoaderMres *local_250;
  char buf [16];
  char resname_buf [256];
  char fname_buf [256];
  
  siz_local = siz;
  local_250 = res_ifc;
  read_data(this,buf,2,&siz_local);
  uVar1 = (uint)(ushort)buf._0_2_;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    read_data(this,buf_1,1,&siz_local);
    read_len_00 = (ulong)(byte)buf_1[0];
    read_data(this,resname_buf,read_len_00,&siz_local);
    resname_buf[read_len_00] = '\0';
    read_data(this,buf_1,1,&siz_local);
    read_len = (ulong)(byte)buf_1[0];
    read_data(this,fname_buf,read_len,&siz_local);
    fname_buf[read_len] = '\0';
    (*local_250->_vptr_CVmImageLoaderMres[3])(local_250,fname_buf,read_len,resname_buf,read_len_00);
  }
  if (siz_local != 0) {
    (*this->fp_->_vptr_CVmImageFile[9])();
  }
  return;
}

Assistant:

void CVmImageLoader::load_mres_link(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    uint i;

    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        char buf[1];
        uint resname_len, fname_len;
        char resname_buf[256], fname_buf[256];

        /* read the resource name */
        read_data(buf, 1, &siz);
        resname_len = (uchar)buf[0];
        read_data(resname_buf, resname_len, &siz);
        resname_buf[resname_len] = '\0';

        /* read the local filename this resource is linked to */
        read_data(buf, 1, &siz);
        fname_len = (uchar)buf[0];
        read_data(fname_buf, fname_len, &siz);
        fname_buf[fname_len] = '\0';

        /* add the resource to the resource interface */
        res_ifc->add_resource(fname_buf, fname_len, resname_buf, resname_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}